

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_mus_opl.cpp
# Opt level: O3

void __thiscall OPLMUSSong::Play(OPLMUSSong *this,bool looping,int subsong)

{
  SoundStream *pSVar1;
  int iVar2;
  
  (this->super_StreamSong).super_MusInfo.m_Status = STATE_Stopped;
  (this->super_StreamSong).super_MusInfo.m_Looping = looping;
  OPLmusicFile::SetLooping(this->Music,looping);
  (*(this->Music->super_OPLmusicBlock)._vptr_OPLmusicBlock[2])();
  pSVar1 = (this->super_StreamSong).m_Stream;
  if ((pSVar1 != (SoundStream *)0x0) &&
     (iVar2 = (*pSVar1->_vptr_SoundStream[2])(snd_musicvolume.Value,pSVar1,1), (char)iVar2 == '\0'))
  {
    return;
  }
  (this->super_StreamSong).super_MusInfo.m_Status = STATE_Playing;
  return;
}

Assistant:

void OPLMUSSong::Play (bool looping, int subsong)
{
	m_Status = STATE_Stopped;
	m_Looping = looping;

	Music->SetLooping (looping);
	Music->Restart ();

	if (m_Stream == NULL || m_Stream->Play (true, snd_musicvolume))
	{
		m_Status = STATE_Playing;
	}
}